

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaopen_io(lua_State *L)

{
  int iVar1;
  int nrec;
  
  lua_getfield(L,-10000,"FILE*");
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    L->top = L->top + -1;
    lua_createtable(L,0,nrec);
    lua_pushvalue(L,-1);
    lua_setfield(L,-10000,"FILE*");
  }
  lua_pushvalue(L,-1);
  lua_setfield(L,-2,"__index");
  luaL_register(L,(char *)0x0,flib);
  newfenv(L,io_fclose);
  lua_replace(L,-0x2711);
  luaL_register(L,"io",iolib);
  newfenv(L,io_noclose);
  createstdfile(L,_stdin,1,"stdin");
  createstdfile(L,_stdout,2,"stdout");
  createstdfile(L,_stderr,0,"stderr");
  L->top = L->top + -1;
  lua_getfield(L,-1,"popen");
  iVar1 = 0x10ef45;
  newfenv(L,io_pclose);
  lua_setfenv(L,iVar1);
  L->top = L->top + -1;
  return 1;
}

Assistant:

static int luaopen_io(lua_State*L){
createmeta(L);
newfenv(L,io_fclose);
lua_replace(L,(-10001));
luaL_register(L,"io",iolib);
newfenv(L,io_noclose);
createstdfile(L,stdin,1,"stdin");
createstdfile(L,stdout,2,"stdout");
createstdfile(L,stderr,0,"stderr");
lua_pop(L,1);
lua_getfield(L,-1,"popen");
newfenv(L,io_pclose);
lua_setfenv(L,-2);
lua_pop(L,1);
return 1;
}